

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  undefined8 uVar1;
  bool bVar2;
  Config *pCVar3;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *__x;
  pointer pTVar4;
  size_type sVar5;
  reference filterGroup_00;
  byte local_3b1;
  undefined1 local_390 [64];
  undefined1 local_350 [40];
  size_t i;
  RunContext context;
  allocator local_b1;
  string local_b0 [32];
  undefined1 local_90 [8];
  TestCaseFilters filterGroup;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> filterGroups;
  Runner *this_local;
  
  pCVar3 = Ptr<Catch::Config>::operator->(&this->m_config);
  __x = Config::filters(pCVar3);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::vector
            ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
             &filterGroup.field_0x60,__x);
  bVar2 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                    ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
                     &filterGroup.field_0x60);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"",&local_b1);
    TestCaseFilters::TestCaseFilters((TestCaseFilters *)local_90,(string *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::push_back
              ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
               &filterGroup.field_0x60,(value_type *)local_90);
    TestCaseFilters::~TestCaseFilters((TestCaseFilters *)local_90);
  }
  pCVar3 = Ptr<Catch::Config>::get(&this->m_config);
  Ptr<const_Catch::IConfig>::Ptr((Ptr<const_Catch::IConfig> *)&i,(IConfig *)pCVar3);
  RunContext::RunContext
            ((RunContext *)&stack0xfffffffffffffce0,(Ptr<const_Catch::IConfig> *)&i,
             &this->m_reporter);
  Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)&i);
  Totals::Totals(__return_storage_ptr__);
  local_350._32_8_ = (pointer)0x0;
  while( true ) {
    uVar1 = local_350._32_8_;
    pTVar4 = (pointer)std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::
                      size((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>
                            *)&filterGroup.field_0x60);
    local_3b1 = 0;
    if ((ulong)uVar1 < pTVar4) {
      bVar2 = RunContext::aborting((RunContext *)&stack0xfffffffffffffce0);
      local_3b1 = bVar2 ^ 0xff;
    }
    if ((local_3b1 & 1) == 0) break;
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::operator[]
              ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
               &filterGroup.field_0x60,local_350._32_8_);
    TestCaseFilters::getName_abi_cxx11_((TestCaseFilters *)local_350);
    uVar1 = local_350._32_8_;
    sVar5 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::size
                      ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
                       &filterGroup.field_0x60);
    RunContext::testGroupStarting
              ((RunContext *)&stack0xfffffffffffffce0,(string *)local_350,uVar1,sVar5);
    std::__cxx11::string::~string((string *)local_350);
    filterGroup_00 =
         std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::operator[]
                   ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
                    &filterGroup.field_0x60,local_350._32_8_);
    runTestsForGroup((Totals *)(local_390 + 0x20),this,(RunContext *)&stack0xfffffffffffffce0,
                     filterGroup_00);
    Totals::operator+=(__return_storage_ptr__,(Totals *)(local_390 + 0x20));
    std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::operator[]
              ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
               &filterGroup.field_0x60,local_350._32_8_);
    TestCaseFilters::getName_abi_cxx11_((TestCaseFilters *)local_390);
    uVar1 = local_350._32_8_;
    sVar5 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::size
                      ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
                       &filterGroup.field_0x60);
    RunContext::testGroupEnded
              ((RunContext *)&stack0xfffffffffffffce0,(string *)local_390,__return_storage_ptr__,
               uVar1,sVar5);
    std::__cxx11::string::~string((string *)local_390);
    local_350._32_8_ = local_350._32_8_ + 1;
  }
  RunContext::~RunContext((RunContext *)&stack0xfffffffffffffce0);
  std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::~vector
            ((vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *)
             &filterGroup.field_0x60);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            std::vector<TestCaseFilters> filterGroups = m_config->filters();
            if( filterGroups.empty() ) {
                TestCaseFilters filterGroup( "" );
                filterGroups.push_back( filterGroup );
            }

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            for( std::size_t i=0; i < filterGroups.size() && !context.aborting(); ++i ) {
                context.testGroupStarting( filterGroups[i].getName(), i, filterGroups.size() );
                totals += runTestsForGroup( context, filterGroups[i] );
                context.testGroupEnded( filterGroups[i].getName(), totals, i, filterGroups.size() );
            }
            return totals;
        }